

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O1

void test_sort<std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>,std::vector<signed_char,std::allocator<signed_char>>,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<signed_char,std::allocator<signed_char>>(std::vector<signed_char,std::allocator<signed_char>>)>>
               (string *name,
               function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>
               *sort,vector<signed_char,_std::allocator<signed_char>_> *numbers,size_t attempts,
               function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
               *statistic,
               function<std::vector<signed_char,_std::allocator<signed_char>_>_(std::vector<signed_char,_std::allocator<signed_char>_>)>
               *prepare)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  duration<long,_std::ratio<1L,_1000000000L>_> dVar4;
  ostream *poVar5;
  undefined8 uVar6;
  type attempt_time;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  times;
  vector<signed_char,_std::allocator<signed_char>_> unsorted;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> local_b0
  ;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  local_a8;
  vector<signed_char,_std::allocator<signed_char>_> local_90;
  string *local_78;
  vector<signed_char,_std::allocator<signed_char>_> *local_70;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  local_68;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> local_50
  ;
  vector<signed_char,_std::allocator<signed_char>_> local_48;
  
  local_a8.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (duration<long,_std::ratio<1L,_1000000000L>_> *)0x0;
  local_a8.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (duration<long,_std::ratio<1L,_1000000000L>_> *)0x0;
  local_78 = name;
  local_70 = numbers;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::reserve(&local_a8,attempts);
  if (attempts != 0) {
    do {
      std::vector<signed_char,_std::allocator<signed_char>_>::vector(&local_48,local_70);
      if ((prepare->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
LAB_00137abe:
        std::__throw_bad_function_call();
        goto LAB_00137ac3;
      }
      (*prepare->_M_invoker)(&local_90,(_Any_data *)prepare,&local_48);
      if (local_48.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar2 = std::chrono::_V2::steady_clock::now();
      local_b0._M_current =
           (char *)CONCAT71(local_90.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_90.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_1_);
      local_50._M_current =
           local_90.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if ((sort->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00137abe;
      (*sort->_M_invoker)((_Any_data *)sort,&local_b0,&local_50);
      lVar3 = std::chrono::_V2::steady_clock::now();
      local_b0._M_current = (char *)(lVar3 - lVar2);
      if (local_a8.
          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_a8.
          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
        ::_M_realloc_insert<std::chrono::duration<long,std::ratio<1l,1000000000l>>const&>
                  ((vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    *)&local_a8,
                   (iterator)
                   local_a8.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (duration<long,_std::ratio<1L,_1000000000L>_> *)&local_b0);
      }
      else {
        (local_a8.
         super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->__r = (rep)local_b0._M_current;
        local_a8.
        super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_a8.
             super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pvVar1 = (void *)CONCAT71(local_90.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_90.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_1_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,(long)local_90.
                                     super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar1);
      }
      attempts = attempts - 1;
    } while (attempts != 0);
  }
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::vector(&local_68,&local_a8);
  if ((statistic->super__Function_base)._M_manager != (_Manager_type)0x0) {
    dVar4 = (*statistic->_M_invoker)((_Any_data *)statistic,&local_68);
    if (local_68.
        super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(local_78->_M_dataplus)._M_p,
                        local_78->_M_string_length);
    local_90.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_90,1);
    poVar5 = std::ostream::_M_insert<double>((double)dVar4.__r / 1000000000.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_a8.
        super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
LAB_00137ac3:
  uVar6 = std::__throw_bad_function_call();
  if (local_a8.
      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

void
    test_sort
    (
        const std::string & name,
        Sort sort,
        const Container & numbers,
        std::size_t attempts,
        UnaryFunction1 statistic,
        UnaryFunction2 prepare
    )
{
    using namespace std::chrono;
    std::vector<clock_type::duration> times;
    times.reserve(attempts);

    for (std::size_t attempt = 0; attempt < attempts; ++attempt)
    {
        auto unsorted = prepare(numbers);

        auto attempt_start_time = clock_type::now();
        sort(unsorted.begin(), unsorted.end());
        auto attempt_time = clock_type::now() - attempt_start_time;
        times.push_back(attempt_time);
    }

    const auto stat = statistic(times);
    std::cout << name << ' ' << duration_cast<duration<double>>(stat).count() << std::endl;
}